

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

void __thiscall QPDF::QPDF(QPDF *this)

{
  atomic<unsigned_long_long> aVar1;
  pointer pMVar2;
  QPDF *this_local;
  
  std::make_unique<QPDF::Members>();
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  ::qpdf::Tokenizer::allowEOF(&pMVar2->tokenizer);
  aVar1 = QPDF::unique_id;
  LOCK();
  QPDF::unique_id.super___atomic_base<unsigned_long_long>._M_i =
       (__atomic_base<unsigned_long_long>)
       ((long)QPDF::unique_id.super___atomic_base<unsigned_long_long>._M_i + 1);
  UNLOCK();
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  pMVar2->unique_id = (unsigned_long_long)aVar1.super___atomic_base<unsigned_long_long>._M_i;
  return;
}

Assistant:

QPDF::QPDF() :
    m(std::make_unique<Members>())
{
    m->tokenizer.allowEOF();
    // Generate a unique ID. It just has to be unique among all QPDF objects allocated throughout
    // the lifetime of this running application.
    static std::atomic<unsigned long long> unique_id{0};
    m->unique_id = unique_id.fetch_add(1ULL);
}